

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Reader.cpp
# Opt level: O0

void __thiscall
adios2::core::engine::BP5Reader::BP5Reader
          (BP5Reader *this,IO *io,string *name,Mode mode,Comm *comm,char *md,size_t mdsize)

{
  int iVar1;
  long *in_RDI;
  char *in_stack_00000048;
  BP5Reader *in_stack_00000050;
  ScopedTimer __var255;
  Comm *in_stack_000004a8;
  JSONProfiler *in_stack_000004b0;
  Comm *in_stack_fffffffffffffe98;
  Minifooter *in_stack_fffffffffffffea0;
  IO *in_stack_fffffffffffffea8;
  BP5Engine *in_stack_fffffffffffffeb0;
  BufferSTL *this_00;
  Comm *in_stack_fffffffffffffef8;
  undefined8 in_stack_ffffffffffffff00;
  Mode openMode;
  string *in_stack_ffffffffffffff08;
  string *this_01;
  IO *in_stack_ffffffffffffff10;
  allocator *paVar2;
  string *in_stack_ffffffffffffff18;
  Engine *in_stack_ffffffffffffff20;
  allocator local_71 [32];
  allocator local_51;
  string local_50 [80];
  
  openMode = (Mode)((ulong)in_stack_ffffffffffffff00 >> 0x20);
  BP5Engine::BP5Engine(in_stack_fffffffffffffeb0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"BP5Reader",&local_51);
  helper::Comm::Comm((Comm *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  Engine::Engine(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                 in_stack_ffffffffffffff08,openMode,in_stack_fffffffffffffef8);
  helper::Comm::~Comm((Comm *)0xa5ab5e);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  *in_RDI = (long)&PTR__BP5Reader_0112f0c0;
  in_RDI[0x52] = 0;
  transportman::TransportMan::TransportMan
            ((TransportMan *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
             (Comm *)in_stack_fffffffffffffea0);
  in_RDI[0x5d] = 0;
  in_RDI[0x5e] = 0;
  in_RDI[0x5f] = 0;
  transportman::TransportMan::TransportMan
            ((TransportMan *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
             (Comm *)in_stack_fffffffffffffea0);
  transportman::TransportMan::TransportMan
            ((TransportMan *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
             (Comm *)in_stack_fffffffffffffea0);
  transportman::TransportMan::TransportMan
            ((TransportMan *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
             (Comm *)in_stack_fffffffffffffea0);
  in_RDI[0x7e] = 0;
  in_RDI[0x7f] = 0;
  in_RDI[0x80] = 0;
  transportman::TransportMan::TransportMan
            ((TransportMan *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
             (Comm *)in_stack_fffffffffffffea0);
  *(undefined1 *)(in_RDI + 0x8b) = 0;
  std::unique_ptr<adios2::Remote,std::default_delete<adios2::Remote>>::
  unique_ptr<std::default_delete<adios2::Remote>,void>
            ((unique_ptr<adios2::Remote,_std::default_delete<adios2::Remote>_> *)
             in_stack_fffffffffffffea0);
  *(undefined1 *)(in_RDI + 0x8d) = 1;
  profiling::JSONProfiler::JSONProfiler(in_stack_000004b0,in_stack_000004a8);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::MinVarInfo_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::MinVarInfo_*>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::MinVarInfo_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::MinVarInfo_*>_>_>
                   *)0xa5ad1c);
  this_01 = (string *)(in_RDI + 0xa7);
  paVar2 = local_71;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(this_01,"",paVar2);
  std::allocator<char>::~allocator((allocator<char> *)local_71);
  in_RDI[0xab] = 0;
  in_RDI[0xac] = 0;
  in_RDI[0xad] = 0;
  in_RDI[0xae] = 0;
  in_RDI[0xaf] = 0;
  *(undefined1 *)(in_RDI + 0xb0) = 1;
  helper::RangeFilter::RangeFilter((RangeFilter *)in_stack_fffffffffffffea0);
  this_00 = (BufferSTL *)(in_RDI + 0xb9);
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::vector((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            *)0xa5add8);
  BP5Engine::Minifooter::Minifooter(in_stack_fffffffffffffea0);
  *(undefined1 *)(in_RDI + 0xc4) = 0;
  *(undefined1 *)((long)in_RDI + 0x621) = 1;
  *(undefined4 *)((long)in_RDI + 0x624) = 0;
  *(undefined1 *)(in_RDI + 0xc5) = 1;
  *(undefined1 *)((long)in_RDI + 0x629) = 1;
  *(undefined1 *)((long)in_RDI + 0x62a) = 0;
  adios2::format::BufferSTL::BufferSTL(this_00);
  adios2::format::BufferSTL::BufferSTL(this_00);
  adios2::format::BufferMalloc::BufferMalloc((BufferMalloc *)this_00);
  std::
  map<unsigned_long,_adios2::core::engine::BP5Reader::WriterMapStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_adios2::core::engine::BP5Reader::WriterMapStruct>_>_>
  ::map((map<unsigned_long,_adios2::core::engine::BP5Reader::WriterMapStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_adios2::core::engine::BP5Reader::WriterMapStruct>_>_>
         *)0xa5ae88);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xa5aea1);
  helper::Comm::Comm((Comm *)0xa5aeba);
  helper::Comm::Comm((Comm *)0xa5aed5);
  std::
  vector<adios2::transportman::TransportMan,_std::allocator<adios2::transportman::TransportMan>_>::
  vector((vector<adios2::transportman::TransportMan,_std::allocator<adios2::transportman::TransportMan>_>
          *)0xa5aef0);
  if (BP5Reader(adios2::core::IO&,std::__cxx11::string_const&,adios2::Mode,adios2::helper::Comm,char_const*,unsigned_long)
      ::__var55 == '\0') {
    iVar1 = __cxa_guard_acquire(&BP5Reader(adios2::core::IO&,std::__cxx11::string_const&,adios2::Mode,adios2::helper::Comm,char_const*,unsigned_long)
                                 ::__var55);
    if (iVar1 != 0) {
      BP5Reader::__var55 = (void *)ps_timer_create_("BP5Reader::Open");
      in_stack_fffffffffffffea0 = (Minifooter *)BP5Reader::__var55;
      __cxa_guard_release(&BP5Reader(adios2::core::IO&,std::__cxx11::string_const&,adios2::Mode,adios2::helper::Comm,char_const*,unsigned_long)
                           ::__var55);
    }
  }
  external::perfstubs_profiler::ScopedTimer::ScopedTimer
            ((ScopedTimer *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  *(undefined1 *)((long)in_RDI + 0x621) = 0;
  (**(code **)(*in_RDI + 0xa8))();
  ProcessMetadataFromMemory(in_stack_00000050,in_stack_00000048);
  *(undefined1 *)(in_RDI + 0x10) = 1;
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer((ScopedTimer *)in_stack_fffffffffffffea0);
  return;
}

Assistant:

BP5Reader::BP5Reader(IO &io, const std::string &name, const Mode mode, helper::Comm comm,
                     const char *md, const size_t mdsize)
: Engine("BP5Reader", io, name, mode, std::move(comm)), m_MDFileManager(io, m_Comm),
  m_DataFileManager(io, m_Comm), m_MDIndexFileManager(io, m_Comm),
  m_FileMetaMetadataManager(io, m_Comm), m_ActiveFlagFileManager(io, m_Comm), m_Remote(),
  m_JSONProfiler(m_Comm)
{
    PERFSTUBS_SCOPED_TIMER("BP5Reader::Open");
    m_ReadMetadataFromFile = false;
    Init();
    ProcessMetadataFromMemory(md);
    m_IsOpen = true;
}